

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

void __thiscall Parser_TokenizerErrors_Test::TestBody(Parser_TokenizerErrors_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  char *in_R9;
  bool gotError;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  AssertionResult gtest_ar_;
  internal local_1c1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  AssertHelper local_1b8;
  undefined1 local_1b0 [8];
  internal local_1a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  _Any_data local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  string local_138;
  string local_118;
  _Any_data local_f8;
  code *pcStack_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *pcStack_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *pcStack_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *pcStack_88;
  code *pcStack_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  local_1c1 = (internal)0x0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"Shape\"sphere\"\t\t # foo bar\n\"float radius","");
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:75:20)>
               ::_M_invoke;
  pcStack_88 = std::
               _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:75:20)>
               ::_M_manager;
  local_98._M_unused._M_object = &local_1c1;
  pbrt::Tokenizer::CreateFromString
            ((Tokenizer *)local_1b0,&local_118,
             (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_98);
  if (pcStack_88 != (code *)0x0) {
    (*pcStack_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  auVar1 = local_1b0;
  local_1a8[0] = (internal)(local_1b0 != (undefined1  [8])0x0);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1b0 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_198,local_1a8,(AssertionResult *)"t.get() != nullptr","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
               ,0x50,(char *)local_198._M_unused._0_8_);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_unused._0_8_ != &local_188) {
      operator_delete(local_198._M_unused._M_object,(ulong)(local_188._M_allocated_capacity + 1));
    }
    if (local_1c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c0.ptr_ + 8))();
      }
      local_1c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    extract_abi_cxx11_(&local_30,(Tokenizer *)local_1b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30);
    local_1a8[0] = local_1c1;
    local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1c1 == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_198,local_1a8,(AssertionResult *)"gotError","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                 ,0x52,(char *)local_198._M_unused._0_8_);
      testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_unused._0_8_ != &local_188) {
        operator_delete(local_198._M_unused._M_object,(ulong)(local_188._M_allocated_capacity + 1));
      }
      if (local_1c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_1c0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1c0.ptr_ + 8))();
        }
        local_1c0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
            ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_1b0);
  if (auVar1 != (undefined1  [8])0x0) {
    local_1c1 = (internal)0x0;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"Shape\"sphere\"\t\t # foo bar\n\"float radius","");
    local_b8._8_8_ = 0;
    pcStack_a0 = std::
                 _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:87:20)>
                 ::_M_invoke;
    pcStack_a8 = std::
                 _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:87:20)>
                 ::_M_manager;
    local_b8._M_unused._M_object = &local_1c1;
    pbrt::Tokenizer::CreateFromString
              ((Tokenizer *)local_1b0,&local_138,
               (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_b8);
    if (pcStack_a8 != (code *)0x0) {
      (*pcStack_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    auVar1 = local_1b0;
    local_1a8[0] = (internal)(local_1b0 != (undefined1  [8])0x0);
    local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1b0 == (undefined1  [8])0x0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_198,local_1a8,(AssertionResult *)"t.get() != nullptr","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                 ,0x5c,(char *)local_198._M_unused._0_8_);
      testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_unused._0_8_ != &local_188) {
        operator_delete(local_198._M_unused._M_object,(ulong)(local_188._M_allocated_capacity + 1));
      }
      if (local_1c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_1c0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1c0.ptr_ + 8))();
        }
        local_1c0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      extract_abi_cxx11_(&local_48,(Tokenizer *)local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      local_1a8[0] = local_1c1;
      local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_1c1 == (internal)0x0) {
        testing::Message::Message((Message *)&local_1c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_198,local_1a8,(AssertionResult *)"gotError","false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                   ,0x5e,(char *)local_198._M_unused._0_8_);
        testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_unused._0_8_ != &local_188) {
          operator_delete(local_198._M_unused._M_object,(ulong)(local_188._M_allocated_capacity + 1)
                         );
        }
        if (local_1c0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_1c0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1c0.ptr_ + 8))();
          }
          local_1c0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_1b0);
    if (auVar1 != (undefined1  [8])0x0) {
      local_1c1 = (internal)0x0;
      local_158._M_allocated_capacity = (size_type)&local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"Shape\"sphere\"\t\t # foo bar\n\"float radius\\","");
      local_d8._8_8_ = 0;
      pcStack_c0 = std::
                   _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:99:20)>
                   ::_M_invoke;
      pcStack_c8 = std::
                   _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:99:20)>
                   ::_M_manager;
      local_d8._M_unused._M_object = &local_1c1;
      pbrt::Tokenizer::CreateFromString
                ((Tokenizer *)local_1b0,(string *)&local_158,
                 (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_d8);
      if (pcStack_c8 != (code *)0x0) {
        (*pcStack_c8)(&local_d8,&local_d8,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_allocated_capacity != &local_148) {
        operator_delete((void *)local_158._M_allocated_capacity,
                        (ulong)(local_148._M_allocated_capacity + 1));
      }
      auVar1 = local_1b0;
      local_1a8[0] = (internal)(local_1b0 != (undefined1  [8])0x0);
      local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_1b0 == (undefined1  [8])0x0) {
        testing::Message::Message((Message *)&local_1c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_198,local_1a8,(AssertionResult *)"t.get() != nullptr","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                   ,0x68,(char *)local_198._M_unused._0_8_);
        testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_unused._0_8_ != &local_188) {
          operator_delete(local_198._M_unused._M_object,(ulong)(local_188._M_allocated_capacity + 1)
                         );
        }
        if (local_1c0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_1c0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1c0.ptr_ + 8))();
          }
          local_1c0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        extract_abi_cxx11_(&local_60,(Tokenizer *)local_1b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        local_1a8[0] = local_1c1;
        local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c1 == (internal)0x0) {
          testing::Message::Message((Message *)&local_1c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_198,local_1a8,(AssertionResult *)"gotError","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                     ,0x6a,(char *)local_198._M_unused._0_8_);
          testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
          testing::internal::AssertHelper::~AssertHelper(&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_unused._0_8_ != &local_188) {
            operator_delete(local_198._M_unused._M_object,
                            (ulong)(local_188._M_allocated_capacity + 1));
          }
          if (local_1c0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1c0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1c0.ptr_ + 8))();
            }
            local_1c0.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_1b0);
      if (auVar1 != (undefined1  [8])0x0) {
        local_1c1 = (internal)0x0;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"Shape\"sphere\"\t\t # foo bar\n\"float radius\n\" 5","");
        local_f8._8_8_ = 0;
        pcStack_e0 = std::
                     _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:111:20)>
                     ::_M_invoke;
        pcStack_e8 = std::
                     _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:111:20)>
                     ::_M_manager;
        local_f8._M_unused._M_object = &local_1c1;
        pbrt::Tokenizer::CreateFromString
                  ((Tokenizer *)local_1b0,&local_178,
                   (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_f8);
        if (pcStack_e8 != (code *)0x0) {
          (*pcStack_e8)(&local_f8,&local_f8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          (ulong)(local_178.field_2._M_allocated_capacity + 1));
        }
        local_1a8[0] = (internal)(local_1b0 != (undefined1  [8])0x0);
        local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1b0 == (undefined1  [8])0x0) {
          testing::Message::Message((Message *)&local_1c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_198,local_1a8,(AssertionResult *)"t.get() != nullptr","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                     ,0x74,(char *)local_198._M_unused._0_8_);
          testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
          testing::internal::AssertHelper::~AssertHelper(&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_unused._0_8_ != &local_188) {
            operator_delete(local_198._M_unused._M_object,
                            (ulong)(local_188._M_allocated_capacity + 1));
          }
          if (local_1c0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1c0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1c0.ptr_ + 8))();
            }
            local_1c0.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_1a0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_1a0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          extract_abi_cxx11_(&local_78,(Tokenizer *)local_1b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
          local_1a8[0] = local_1c1;
          local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_1c1 == (internal)0x0) {
            testing::Message::Message((Message *)&local_1c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_198,local_1a8,(AssertionResult *)"gotError","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                       ,0x76,(char *)local_198._M_unused._0_8_);
            testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
            testing::internal::AssertHelper::~AssertHelper(&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_unused._0_8_ != &local_188) {
              operator_delete(local_198._M_unused._M_object,
                              (ulong)(local_188._M_allocated_capacity + 1));
            }
            if (local_1c0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_1c0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_1c0.ptr_ + 8))();
              }
              local_1c0.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_1a0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                  ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_1b0);
      }
    }
  }
  return;
}

Assistant:

TEST(Parser, TokenizerErrors) {
    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "premature EOF");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }

    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "premature EOF");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }

    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "premature EOF");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius\\", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }

    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "unterminated string");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius\n\" 5", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }
}